

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void print_char(FILE *f,mir_ulong ch)

{
  ushort **ppuVar1;
  char *__format;
  
  if (ch < 0x100) {
    if (((char)ch == '\\') || (((uint)ch & 0xff) == 0x22)) {
      fputc(0x5c,(FILE *)f);
    }
    ppuVar1 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar1 + ch * 2 + 1) & 0x40) != 0) {
      fputc((uint)ch,(FILE *)f);
      return;
    }
    __format = "\\%o";
  }
  else {
    __format = "\\U%08x";
    if (ch < 0x10000) {
      __format = "\\u%04x";
    }
  }
  fprintf((FILE *)f,__format,ch & 0xffffffff);
  return;
}

Assistant:

static void print_char (FILE *f, mir_ulong ch) {
  if (ch >= 0x100) {
    fprintf (f, ch <= 0xFFFF ? "\\u%04x" : "\\U%08x", (unsigned int) ch);
  } else {
    if (ch == '"' || ch == '\"' || ch == '\\') fprintf (f, "\\");
    if (isprint (ch))
      fprintf (f, "%c", (unsigned int) ch);
    else
      fprintf (f, "\\%o", (unsigned int) ch);
  }
}